

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::MidiFile(MidiFile *this,string *filename)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  pointer ppMVar2;
  
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_ticksPerQuarterNote = 0x78;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  (this->m_readFileName)._M_dataplus._M_p = (pointer)&(this->m_readFileName).field_2;
  (this->m_readFileName)._M_string_length = 0;
  (this->m_readFileName).field_2._M_local_buf[0] = '\0';
  this->m_timemapvalid = false;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  __buf = extraout_RDX;
  for (ppMVar2 = (this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppMVar2 != ppMVar1; ppMVar2 = ppMVar2 + 1
      ) {
    this_00 = (MidiEventList *)operator_new(0x18);
    MidiEventList::MidiEventList(this_00);
    *ppMVar2 = this_00;
    __buf = extraout_RDX_00;
  }
  read(this,(int)filename,__buf,in_RCX);
  return;
}

Assistant:

MidiFile::MidiFile(const std::string& filename) {
	m_events.resize(1);
	for (auto &event : m_events) {
		event = new MidiEventList;
	}
	read(filename);
}